

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.h
# Opt level: O0

void __thiscall tok_embed_ctx::end_expr(tok_embed_ctx *this)

{
  tok_embed_ctx *this_local;
  
  if (0 < this->level) {
    this->level = this->level + -1;
  }
  if (this->level == 0) {
    this->s = (tok_embed_level *)0x0;
  }
  else if (this->level < 10) {
    this->s = this->stk + (long)this->level + -1;
  }
  return;
}

Assistant:

void end_expr()
    {
        if (level > 0)
            --level;
        if (level == 0)
            s = 0;
		else if (level < (int)countof(stk))
            s = stk + level - 1;
    }